

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

SourceRange __thiscall slang::syntax::SyntaxNode::sourceRange(SyntaxNode *this)

{
  SourceLocation startLoc;
  SourceLocation endLoc;
  unsigned_long in_RDI;
  Token lastToken;
  Token firstToken;
  Token *this_00;
  Token *in_stack_ffffffffffffffa0;
  SyntaxNode *in_stack_ffffffffffffffc0;
  Token local_38;
  Token local_28;
  SourceRange local_10;
  
  local_28 = getFirstToken(in_stack_ffffffffffffffc0);
  local_38 = getLastToken(in_stack_ffffffffffffffc0);
  startLoc = parsing::Token::location(&local_28);
  this_00 = &local_38;
  parsing::Token::location(this_00);
  parsing::Token::rawText(in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::length
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffa0);
  endLoc = SourceLocation::operator+<unsigned_long>((SourceLocation *)this_00,in_RDI);
  SourceRange::SourceRange(&local_10,startLoc,endLoc);
  return local_10;
}

Assistant:

SourceRange SyntaxNode::sourceRange() const {
    Token firstToken = getFirstToken();
    Token lastToken = getLastToken();
    return SourceRange(firstToken.location(), lastToken.location() + lastToken.rawText().length());
}